

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_internal_buf_reserve(mcpl_buffer_t *buf,size_t n)

{
  void *__src;
  char *__dest;
  ulong in_RSI;
  undefined8 *in_RDI;
  char *newbuf;
  char *oldbuf;
  size_t in_stack_ffffffffffffffe0;
  
  if ((ulong)in_RDI[2] < in_RSI) {
    __src = (void *)*in_RDI;
    __dest = mcpl_internal_malloc(in_stack_ffffffffffffffe0);
    memcpy(__dest,__src,in_RDI[1]);
    *in_RDI = __dest;
    in_RDI[2] = in_RSI;
    free(__src);
  }
  return;
}

Assistant:

MCPL_LOCAL void mcpl_internal_buf_reserve(mcpl_buffer_t* buf, size_t n)
{
  if ( n <= buf->capacity )
    return;
  char * oldbuf = buf->buf;
  char * newbuf = mcpl_internal_malloc( n );
  memcpy( newbuf, oldbuf, buf->size );
  buf->buf = newbuf;
  buf->capacity = n;
  free(oldbuf);
}